

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O2

optional<int>
slang::ast::bindArrayIndexSetter
          (ASTContext *context,Expression *keyExpr,Type *elementType,ExpressionSyntax *valueSyntax,
          SmallMap<int,_const_slang::ast::Expression_*,_8UL,_std::pair<const_int,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
          *indexMap,
          SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
          *indexSetters)

{
  char *pcVar1;
  undefined4 uVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  _Optional_payload_base<int> _Var7;
  Expression *this;
  Diagnostic *this_00;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  ulong hash;
  _Storage<int,_true> arg;
  char cVar13;
  char cVar14;
  char cVar15;
  byte bVar16;
  undefined1 auVar17 [16];
  optional<int> index;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff68;
  try_emplace_args_t local_89;
  Expression *local_88;
  _Optional_payload_base<int> local_80;
  undefined1 *local_78;
  SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter> *local_70;
  Expression *local_68;
  ulong local_60;
  char local_58;
  char cStack_57;
  char cStack_56;
  byte bStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  byte bStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  byte bStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  byte bStack_49;
  undefined1 local_48 [24];
  
  local_88 = keyExpr;
  local_70 = indexSetters;
  _Var7 = (_Optional_payload_base<int>)
          ASTContext::evalInteger(context,keyExpr,(bitmask<slang::ast::EvalFlags>)0x0);
  if (((ulong)_Var7 >> 0x20 & 1) == 0) {
LAB_003adbe6:
    uVar12 = 0;
    uVar9 = 0;
    uVar8 = 0;
  }
  else {
    uVar12 = 0;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = context;
    local_80 = _Var7;
    this = Expression::bindRValue
                     ((Expression *)elementType,(Type *)valueSyntax,(ExpressionSyntax *)0x0,
                      (SourceRange)(auVar5 << 0x40),(ASTContext *)0x0,in_stack_ffffffffffffff68);
    bVar6 = Expression::bad(this);
    uVar9 = 0;
    uVar8 = 0;
    if (!bVar6) {
      local_78 = &(indexMap->super_Storage).field_0x88;
      arg = _Var7._M_payload;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (long)arg._M_value;
      hash = SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),0);
      uVar9 = hash >> (indexMap->field_0x90 & 0x3f);
      uVar2 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[hash & 0xff];
      local_60 = *(ulong *)&indexMap->field_0x98;
      uVar12 = 0;
      uVar8 = uVar9;
      do {
        pcVar1 = (char *)(*(long *)&indexMap->field_0xa0 + uVar8 * 0x10);
        local_58 = *pcVar1;
        cStack_57 = pcVar1[1];
        cStack_56 = pcVar1[2];
        bStack_55 = pcVar1[3];
        cStack_54 = pcVar1[4];
        cStack_53 = pcVar1[5];
        cStack_52 = pcVar1[6];
        bStack_51 = pcVar1[7];
        cStack_50 = pcVar1[8];
        cStack_4f = pcVar1[9];
        cStack_4e = pcVar1[10];
        bStack_4d = pcVar1[0xb];
        cStack_4c = pcVar1[0xc];
        cStack_4b = pcVar1[0xd];
        cStack_4a = pcVar1[0xe];
        bStack_49 = pcVar1[0xf];
        cVar13 = (char)uVar2;
        auVar17[0] = -(local_58 == cVar13);
        cVar14 = (char)((uint)uVar2 >> 8);
        auVar17[1] = -(cStack_57 == cVar14);
        cVar15 = (char)((uint)uVar2 >> 0x10);
        auVar17[2] = -(cStack_56 == cVar15);
        bVar16 = (byte)((uint)uVar2 >> 0x18);
        auVar17[3] = -(bStack_55 == bVar16);
        auVar17[4] = -(cStack_54 == cVar13);
        auVar17[5] = -(cStack_53 == cVar14);
        auVar17[6] = -(cStack_52 == cVar15);
        auVar17[7] = -(bStack_51 == bVar16);
        auVar17[8] = -(cStack_50 == cVar13);
        auVar17[9] = -(cStack_4f == cVar14);
        auVar17[10] = -(cStack_4e == cVar15);
        auVar17[0xb] = -(bStack_4d == bVar16);
        auVar17[0xc] = -(cStack_4c == cVar13);
        auVar17[0xd] = -(cStack_4b == cVar14);
        auVar17[0xe] = -(cStack_4a == cVar15);
        auVar17[0xf] = -(bStack_49 == bVar16);
        uVar11 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe);
        local_68 = this;
        if (uVar11 != 0) {
          lVar10 = *(long *)&indexMap->field_0xa8 + uVar8 * 0xf0;
          do {
            iVar3 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> iVar3 & 1) == 0; iVar3 = iVar3 + 1) {
              }
            }
            if (*(int *)(lVar10 + (ulong)(uint)(iVar3 << 4)) == arg._M_value) {
              this_00 = ASTContext::addDiag(context,(DiagCode)0x110007,local_88->sourceRange);
              Diagnostic::operator<<<int>(this_00,arg._M_value);
              Diagnostic::addNote(this_00,(DiagCode)0xa0001,
                                  *(SourceRange *)
                                   (*(long *)(lVar10 + (ulong)(uint)(iVar3 << 4) + 8) + 0x20));
              goto LAB_003adbe6;
            }
            uVar11 = uVar11 - 1 & uVar11;
          } while (uVar11 != 0);
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_49) == 0) break;
        lVar10 = uVar8 + uVar12;
        uVar12 = uVar12 + 1;
        uVar8 = lVar10 + 1U & local_60;
      } while (uVar12 <= local_60);
      if (*(ulong *)&indexMap->field_0xb8 < *(ulong *)&indexMap->field_0xb0) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<int,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<int,void>,std::equal_to<int>,slang::detail::hashing::StackAllocator<std::pair<int_const,slang::ast::Expression_const*>,128ul,16ul>>
        ::
        unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,int&,slang::ast::Expression_const*>
                  ((locator *)local_48,
                   (table_core<boost::unordered::detail::foa::flat_map_types<int,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<int,void>,std::equal_to<int>,slang::detail::hashing::StackAllocator<std::pair<int_const,slang::ast::Expression_const*>,128ul,16ul>>
                    *)local_78,uVar9,hash,&local_89,(int *)&local_80,&local_68);
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<int,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<int,void>,std::equal_to<int>,slang::detail::hashing::StackAllocator<std::pair<int_const,slang::ast::Expression_const*>,128ul,16ul>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,int&,slang::ast::Expression_const*>
                  ((locator *)local_48,
                   (table_core<boost::unordered::detail::foa::flat_map_types<int,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<int,void>,std::equal_to<int>,slang::detail::hashing::StackAllocator<std::pair<int_const,slang::ast::Expression_const*>,128ul,16ul>>
                    *)local_78,hash,&local_89,(int *)&local_80,&local_68);
      }
      local_48._0_8_ = local_88;
      local_48._8_8_ = this;
      SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>::
      emplace_back<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
                (local_70,(IndexSetter *)local_48);
      uVar8 = (ulong)local_80 & 0xffffff0000000000;
      uVar12 = (ulong)local_80 & 0xff00000000;
      uVar9 = (ulong)local_80 & 0xffffffff;
    }
  }
  return (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)(uVar12 | uVar9 | uVar8);
}

Assistant:

static std::optional<int32_t> bindArrayIndexSetter(
    const ASTContext& context, const Expression& keyExpr, const Type& elementType,
    const ExpressionSyntax& valueSyntax, SmallMap<int32_t, const Expression*, 8>& indexMap,
    SmallVectorBase<StructuredAssignmentPatternExpression::IndexSetter>& indexSetters) {

    std::optional<int32_t> index = context.evalInteger(keyExpr);
    if (!index)
        return std::nullopt;

    auto& expr = Expression::bindRValue(elementType, valueSyntax, {}, context);
    if (expr.bad())
        return std::nullopt;

    auto [it, inserted] = indexMap.emplace(*index, &expr);
    if (!inserted) {
        auto& diag = context.addDiag(diag::AssignmentPatternKeyDupValue, keyExpr.sourceRange);
        diag << *index;
        diag.addNote(diag::NotePreviousDefinition, it->second->sourceRange);
        return std::nullopt;
    }

    indexSetters.push_back({&keyExpr, &expr});
    return index;
}